

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

Value * __thiscall
BasicBlock::GetValueForConditionalBranch
          (BasicBlock *this,BranchInstr *branch,Opnd *opnd,GlobOpt *globOpt,
          GlobHashTable *localSymToValueMap)

{
  bool bVar1;
  SymID id;
  StackSym *pSVar2;
  SymID varSymID;
  Value *val;
  StackSym *sym;
  GlobHashTable *localSymToValueMap_local;
  GlobOpt *globOpt_local;
  Opnd *opnd_local;
  BranchInstr *branch_local;
  BasicBlock *this_local;
  
  if ((opnd == (Opnd *)0x0) || (pSVar2 = IR::Opnd::GetStackSym(opnd), pSVar2 == (StackSym *)0x0)) {
    this_local = (BasicBlock *)0x0;
  }
  else {
    pSVar2 = IR::Opnd::GetStackSym(opnd);
    this_local = (BasicBlock *)
                 FindValueInLocalThenGlobalValueTableAndUpdate
                           (this,globOpt,localSymToValueMap,&branch->super_Instr,(Sym *)0x0,
                            &pSVar2->super_Sym);
    if ((this_local != (BasicBlock *)0x0) &&
       (((this->loop != (Loop *)0x0 &&
         (id = GlobOpt::GetVarSymID(globOpt,pSVar2), id != (pSVar2->super_Sym).m_id)) &&
        (bVar1 = Loop::IsSymAssignedToInSelfOrParents(this->loop,id), bVar1)))) {
      this_local = (BasicBlock *)0x0;
    }
  }
  return (Value *)this_local;
}

Assistant:

Value* BasicBlock::GetValueForConditionalBranch(
    IR::BranchInstr* branch,
    IR::Opnd* opnd,
    GlobOpt* globOpt,
    GlobHashTable* localSymToValueMap)
{
    if (!opnd || !opnd->GetStackSym())
    {
        return nullptr;
    }

    StackSym* sym = opnd->GetStackSym();

    Value* val = FindValueInLocalThenGlobalValueTableAndUpdate(
        globOpt,
        localSymToValueMap,
        branch,
        nullptr,
        sym);

    if (val != nullptr && this->loop)
    {
        // If this branch is within a loop, the stack sym is type specialized, and the associated
        // var sym is written to within the loop, then we cannot prove the condition: additional
        // assignments to the type specialized sym might be inserted in a later block.
        SymID varSymID = globOpt->GetVarSymID(sym);
        if (varSymID != sym->m_id && this->loop->IsSymAssignedToInSelfOrParents(varSymID))
        {
            return nullptr;
        }
    }

    return val;
}